

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  byte bVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  string *__lhs;
  const_iterator ppcVar6;
  cmTargetInternals *pcVar7;
  cmTargetInternals *pcVar8;
  __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  _Var9;
  __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  _Var10;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar11;
  iterator __first;
  iterator __last;
  char *pcVar12;
  cmGlobalGenerator *pcVar13;
  reference pbVar14;
  cmStringRange cVar15;
  cmBacktraceRange cVar16;
  bool local_1389;
  string local_1318 [8];
  string propValue;
  undefined1 local_12d8 [8];
  string propName;
  size_type assignment;
  string *i;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  undefined1 local_1288 [8];
  string vsGlobal;
  string local_1260;
  undefined1 local_1240 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string genName;
  string local_1200;
  char *local_11e0;
  char *globals;
  string local_11d0;
  allocator<char> local_11a9;
  string local_11a8;
  allocator<char> local_1181;
  string local_1180;
  allocator<char> local_1159;
  string local_1158;
  allocator<char> local_1131;
  string local_1130;
  allocator<char> local_1109;
  string local_1108;
  allocator<char> local_10e1;
  string local_10e0;
  allocator<char> local_10b9;
  string local_10b8;
  allocator<char> local_1091;
  string local_1090;
  allocator<char> local_1069;
  string local_1068;
  allocator<char> local_1041;
  string local_1040;
  allocator<char> local_1019;
  string local_1018;
  allocator<char> local_ff1;
  string local_ff0;
  cmListFileBacktrace *local_fd0;
  cmListFileBacktrace *local_fc8;
  __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_fc0;
  __normal_iterator<cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_fb8;
  const_iterator local_fb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_fa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_fa0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f90;
  const_iterator local_f88;
  undefined1 local_f80 [8];
  cmBacktraceRange parentLinkDirectoriesBts;
  cmStringRange parentLinkDirectories;
  __normal_iterator<cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_f48;
  const_iterator local_f40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f28;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f20;
  const_iterator local_f18;
  undefined1 local_f10 [8];
  cmBacktraceRange parentLinkOptionsBts;
  cmStringRange parentLinkOptions;
  __normal_iterator<cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_ed8;
  const_iterator local_ed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ec0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_eb8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_eb0;
  const_iterator local_ea8;
  undefined1 local_ea0 [8];
  cmBacktraceRange parentCompileOptionsBts;
  cmStringRange parentCompileOptions;
  undefined1 local_e70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parentSystemIncludes;
  __normal_iterator<cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_e28;
  const_iterator local_e20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e08;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e00;
  const_iterator local_df8;
  undefined1 local_df0 [8];
  cmBacktraceRange parentIncludesBts;
  cmStringRange parentIncludes;
  undefined1 local_dc0 [8];
  string property_1;
  undefined1 local_d98 [8];
  string property;
  char **prop;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<const_char_*> *__range3;
  string configUpper;
  string *configName;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_cf8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string local_cd8;
  allocator<char> local_cb1;
  string local_cb0;
  allocator<char> local_c89;
  string local_c88;
  allocator<char> local_c61;
  string local_c60;
  allocator<char> local_c39;
  string local_c38;
  allocator<char> local_c11;
  string local_c10;
  allocator<char> local_be9;
  string local_be8;
  allocator<char> local_bc1;
  string local_bc0;
  allocator<char> local_b99;
  string local_b98;
  allocator<char> local_b71;
  string local_b70;
  allocator<char> local_b49;
  string local_b48;
  allocator<char> local_b21;
  string local_b20;
  allocator<char> local_af9;
  string local_af8;
  allocator<char> local_ad1;
  string local_ad0;
  allocator<char> local_aa9;
  string local_aa8;
  allocator<char> local_a81;
  string local_a80;
  allocator<char> local_a59;
  string local_a58;
  allocator<char> local_a31;
  string local_a30;
  allocator<char> local_a09;
  string local_a08;
  allocator<char> local_9e1;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  allocator<char> local_991;
  string local_990;
  allocator<char> local_969;
  string local_968;
  allocator<char> local_941;
  string local_940;
  allocator<char> local_919;
  string local_918;
  allocator<char> local_8f1;
  string local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  allocator<char> local_879;
  string local_878;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  allocator<char> local_801;
  string local_800;
  allocator<char> local_7d9;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  allocator<char> local_671;
  string local_670;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  cmMakefile *local_28;
  cmMakefile *mf_local;
  Visibility vis_local;
  TargetType type_local;
  string *name_local;
  cmTarget *this_local;
  
  local_28 = mf;
  mf_local._0_4_ = vis;
  mf_local._4_4_ = type;
  _vis_local = name;
  name_local = (string *)this;
  cmPropertyMap::cmPropertyMap(&this->Properties);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->SystemIncludeDirectories);
  std::
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::set(&this->Utilities);
  cmPolicies::PolicyMap::PolicyMap(&this->PolicyMap);
  std::__cxx11::string::string((string *)&this->Name);
  std::__cxx11::string::string((string *)&this->InstallPath);
  std::__cxx11::string::string((string *)&this->RuntimeInstallPath);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PreBuildCommands);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PreLinkCommands);
  std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector(&this->PostBuildCommands);
  std::
  vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
  ::vector(&this->TLLCommands);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ::vector(&this->OriginalLinkLibraries);
  cmTargetInternalPointer::cmTargetInternalPointer(&this->Internal);
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace);
  if (local_28 == (cmMakefile *)0x0) {
    __assert_fail("mf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmTarget.cxx"
                  ,0xb5,
                  "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *)"
                 );
  }
  this->IsGeneratorProvided = false;
  std::__cxx11::string::operator=((string *)&this->Name,(string *)_vis_local);
  this->TargetTypeValue = mf_local._4_4_;
  this->Makefile = local_28;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  local_1389 = (Visibility)mf_local == VisibilityImported ||
               (Visibility)mf_local == VisibilityImportedGlobally;
  this->IsImportedTarget = local_1389;
  this->ImportedGloballyVisible = (Visibility)mf_local == VisibilityImportedGlobally;
  this->BuildInterfaceIncludesAppended = false;
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_IMPORT_LIBRARY_SUFFIX",&local_59);
  cmMakefile::GetSafeDefinition(pcVar1,&local_58);
  bVar2 = std::__cxx11::string::empty();
  this->DLLPlatform = (bool)(bVar2 ^ 1);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_SYSTEM_NAME",&local_81);
  __lhs = cmMakefile::GetSafeDefinition(pcVar1,&local_80);
  bVar3 = std::operator==(__lhs,"Android");
  this->IsAndroid = bVar3;
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), TVar4 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"ANDROID_API",&local_a9);
    SetPropertyDefault(this,&local_a8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"ANDROID_API_MIN",&local_d1);
    SetPropertyDefault(this,&local_d0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"ANDROID_ARCH",&local_f9)
    ;
    SetPropertyDefault(this,&local_f8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"ANDROID_STL_TYPE",&local_121);
    SetPropertyDefault(this,&local_120,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"ANDROID_SKIP_ANT_STEP",&local_149);
    SetPropertyDefault(this,&local_148,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"ANDROID_PROCESS_MAX",&local_171);
    SetPropertyDefault(this,&local_170,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"ANDROID_PROGUARD",&local_199);
    SetPropertyDefault(this,&local_198,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"ANDROID_PROGUARD_CONFIG_PATH",&local_1c1);
    SetPropertyDefault(this,&local_1c0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"ANDROID_SECURE_PROPS_PATH",&local_1e9);
    SetPropertyDefault(this,&local_1e8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"ANDROID_NATIVE_LIB_DIRECTORIES",&local_211);
    SetPropertyDefault(this,&local_210,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"ANDROID_NATIVE_LIB_DEPENDENCIES",&local_239);
    SetPropertyDefault(this,&local_238,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"ANDROID_JAVA_SOURCE_DIR",&local_261);
    SetPropertyDefault(this,&local_260,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"ANDROID_JAR_DIRECTORIES",&local_289);
    SetPropertyDefault(this,&local_288,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"ANDROID_JAR_DEPENDENCIES",&local_2b1);
    SetPropertyDefault(this,&local_2b0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"ANDROID_ASSETS_DIRECTORIES",&local_2d9);
    SetPropertyDefault(this,&local_2d8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"ANDROID_ANT_ADDITIONAL_OPTIONS",&local_301);
    SetPropertyDefault(this,&local_300,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"BUILD_RPATH",&local_329);
    SetPropertyDefault(this,&local_328,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator(&local_329);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"BUILD_RPATH_USE_ORIGIN",&local_351);
    SetPropertyDefault(this,&local_350,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator(&local_351);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"INSTALL_NAME_DIR",&local_379);
    SetPropertyDefault(this,&local_378,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"INSTALL_RPATH",&local_3a1);
    SetPropertyDefault(this,&local_3a0,"");
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator(&local_3a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"INSTALL_RPATH_USE_LINK_PATH",&local_3c9);
    SetPropertyDefault(this,&local_3c8,"OFF");
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator(&local_3c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f0,"INTERPROCEDURAL_OPTIMIZATION",&local_3f1);
    SetPropertyDefault(this,&local_3f0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator(&local_3f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"SKIP_BUILD_RPATH",&local_419);
    SetPropertyDefault(this,&local_418,"OFF");
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator(&local_419);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"BUILD_WITH_INSTALL_RPATH",&local_441);
    SetPropertyDefault(this,&local_440,"OFF");
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,"ARCHIVE_OUTPUT_DIRECTORY",&local_469);
    SetPropertyDefault(this,&local_468,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_490,"LIBRARY_OUTPUT_DIRECTORY",&local_491);
    SetPropertyDefault(this,&local_490,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator(&local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b8,"RUNTIME_OUTPUT_DIRECTORY",&local_4b9);
    SetPropertyDefault(this,&local_4b8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,"PDB_OUTPUT_DIRECTORY",&local_4e1);
    SetPropertyDefault(this,&local_4e0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::allocator<char>::~allocator(&local_4e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_508,"COMPILE_PDB_OUTPUT_DIRECTORY",&local_509);
    SetPropertyDefault(this,&local_508,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator(&local_509);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_530,"Fortran_FORMAT",&local_531);
    SetPropertyDefault(this,&local_530,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_530);
    std::allocator<char>::~allocator(&local_531);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"Fortran_MODULE_DIRECTORY",&local_559);
    SetPropertyDefault(this,&local_558,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator(&local_559);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_580,"Fortran_COMPILER_LAUNCHER",&local_581);
    SetPropertyDefault(this,&local_580,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_580);
    std::allocator<char>::~allocator(&local_581);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"GNUtoMS",&local_5a9);
    SetPropertyDefault(this,&local_5a8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::allocator<char>::~allocator(&local_5a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d0,"OSX_ARCHITECTURES",&local_5d1);
    SetPropertyDefault(this,&local_5d0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::allocator<char>::~allocator(&local_5d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5f8,"IOS_INSTALL_COMBINED",&local_5f9);
    SetPropertyDefault(this,&local_5f8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::allocator<char>::~allocator(&local_5f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"AUTOMOC",&local_621);
    SetPropertyDefault(this,&local_620,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator(&local_621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"AUTOUIC",&local_649);
    SetPropertyDefault(this,&local_648,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_670,"AUTORCC",&local_671);
    SetPropertyDefault(this,&local_670,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_670);
    std::allocator<char>::~allocator(&local_671);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_698,"AUTOGEN_ORIGIN_DEPENDS",&local_699);
    SetPropertyDefault(this,&local_698,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_698);
    std::allocator<char>::~allocator(&local_699);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c0,"AUTOGEN_PARALLEL",&local_6c1);
    SetPropertyDefault(this,&local_6c0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::allocator<char>::~allocator(&local_6c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6e8,"AUTOMOC_COMPILER_PREDEFINES",&local_6e9);
    SetPropertyDefault(this,&local_6e8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator(&local_6e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_710,"AUTOMOC_DEPEND_FILTERS",&local_711);
    SetPropertyDefault(this,&local_710,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator(&local_711);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_738,"AUTOMOC_MACRO_NAMES",&local_739);
    SetPropertyDefault(this,&local_738,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_738);
    std::allocator<char>::~allocator(&local_739);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_760,"AUTOMOC_MOC_OPTIONS",&local_761);
    SetPropertyDefault(this,&local_760,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_760);
    std::allocator<char>::~allocator(&local_761);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_788,"AUTOUIC_OPTIONS",&local_789);
    SetPropertyDefault(this,&local_788,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator(&local_789);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7b0,"AUTOUIC_SEARCH_PATHS",&local_7b1);
    SetPropertyDefault(this,&local_7b0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::allocator<char>::~allocator(&local_7b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d8,"AUTORCC_OPTIONS",&local_7d9);
    SetPropertyDefault(this,&local_7d8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_7d8);
    std::allocator<char>::~allocator(&local_7d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_800,"LINK_DEPENDS_NO_SHARED",&local_801);
    SetPropertyDefault(this,&local_800,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_800);
    std::allocator<char>::~allocator(&local_801);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_828,"LINK_INTERFACE_LIBRARIES",&local_829);
    SetPropertyDefault(this,&local_828,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator(&local_829);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_850,"WIN32_EXECUTABLE",&local_851);
    SetPropertyDefault(this,&local_850,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_850);
    std::allocator<char>::~allocator(&local_851);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_878,"MACOSX_BUNDLE",&local_879);
    SetPropertyDefault(this,&local_878,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_878);
    std::allocator<char>::~allocator(&local_879);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8a0,"MACOSX_RPATH",&local_8a1);
    SetPropertyDefault(this,&local_8a0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_8a0);
    std::allocator<char>::~allocator(&local_8a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8c8,"NO_SYSTEM_FROM_IMPORTED",&local_8c9);
    SetPropertyDefault(this,&local_8c8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_8c8);
    std::allocator<char>::~allocator(&local_8c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8f0,"BUILD_WITH_INSTALL_NAME_DIR",&local_8f1);
    SetPropertyDefault(this,&local_8f0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_8f0);
    std::allocator<char>::~allocator(&local_8f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_918,"C_CLANG_TIDY",&local_919);
    SetPropertyDefault(this,&local_918,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_918);
    std::allocator<char>::~allocator(&local_919);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_940,"C_COMPILER_LAUNCHER",&local_941);
    SetPropertyDefault(this,&local_940,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_940);
    std::allocator<char>::~allocator(&local_941);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,"C_CPPLINT",&local_969);
    SetPropertyDefault(this,&local_968,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_968);
    std::allocator<char>::~allocator(&local_969);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_990,"C_CPPCHECK",&local_991)
    ;
    SetPropertyDefault(this,&local_990,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_990);
    std::allocator<char>::~allocator(&local_991);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b8,"C_INCLUDE_WHAT_YOU_USE",&local_9b9);
    SetPropertyDefault(this,&local_9b8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::allocator<char>::~allocator(&local_9b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9e0,"LINK_WHAT_YOU_USE",&local_9e1);
    SetPropertyDefault(this,&local_9e0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::allocator<char>::~allocator(&local_9e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a08,"C_STANDARD",&local_a09)
    ;
    SetPropertyDefault(this,&local_a08,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_a08);
    std::allocator<char>::~allocator(&local_a09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a30,"C_STANDARD_REQUIRED",&local_a31);
    SetPropertyDefault(this,&local_a30,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_a30);
    std::allocator<char>::~allocator(&local_a31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a58,"C_EXTENSIONS",&local_a59);
    SetPropertyDefault(this,&local_a58,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_a58);
    std::allocator<char>::~allocator(&local_a59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a80,"CXX_CLANG_TIDY",&local_a81);
    SetPropertyDefault(this,&local_a80,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_a80);
    std::allocator<char>::~allocator(&local_a81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_aa8,"CXX_COMPILER_LAUNCHER",&local_aa9);
    SetPropertyDefault(this,&local_aa8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_aa8);
    std::allocator<char>::~allocator(&local_aa9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ad0,"CXX_CPPLINT",&local_ad1);
    SetPropertyDefault(this,&local_ad0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_ad0);
    std::allocator<char>::~allocator(&local_ad1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_af8,"CXX_CPPCHECK",&local_af9);
    SetPropertyDefault(this,&local_af8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_af8);
    std::allocator<char>::~allocator(&local_af9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b20,"CXX_INCLUDE_WHAT_YOU_USE",&local_b21);
    SetPropertyDefault(this,&local_b20,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_b20);
    std::allocator<char>::~allocator(&local_b21);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b48,"CXX_STANDARD",&local_b49);
    SetPropertyDefault(this,&local_b48,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_b48);
    std::allocator<char>::~allocator(&local_b49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b70,"CXX_STANDARD_REQUIRED",&local_b71);
    SetPropertyDefault(this,&local_b70,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_b70);
    std::allocator<char>::~allocator(&local_b71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b98,"CXX_EXTENSIONS",&local_b99);
    SetPropertyDefault(this,&local_b98,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_b98);
    std::allocator<char>::~allocator(&local_b99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bc0,"CUDA_STANDARD",&local_bc1);
    SetPropertyDefault(this,&local_bc0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_bc0);
    std::allocator<char>::~allocator(&local_bc1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_be8,"CUDA_STANDARD_REQUIRED",&local_be9);
    SetPropertyDefault(this,&local_be8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_be8);
    std::allocator<char>::~allocator(&local_be9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c10,"CUDA_EXTENSIONS",&local_c11);
    SetPropertyDefault(this,&local_c10,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_c10);
    std::allocator<char>::~allocator(&local_c11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c38,"CUDA_COMPILER_LAUNCHER",&local_c39);
    SetPropertyDefault(this,&local_c38,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_c38);
    std::allocator<char>::~allocator(&local_c39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c60,"CUDA_SEPARABLE_COMPILATION",&local_c61);
    SetPropertyDefault(this,&local_c60,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_c60);
    std::allocator<char>::~allocator(&local_c61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c88,"LINK_SEARCH_START_STATIC",&local_c89);
    SetPropertyDefault(this,&local_c88,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_c88);
    std::allocator<char>::~allocator(&local_c89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cb0,"LINK_SEARCH_END_STATIC",&local_cb1);
    SetPropertyDefault(this,&local_cb0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_cb0);
    std::allocator<char>::~allocator(&local_cb1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_cd8,"FOLDER",
               (allocator<char> *)
               ((long)&configNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    SetPropertyDefault(this,&local_cd8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_cd8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&configNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_cf8);
  cmMakefile::GetConfigurations
            ((string *)&__range2,local_28,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_cf8,true);
  std::__cxx11::string::~string((string *)&__range2);
  TVar4 = GetType(this);
  if (TVar4 != UTILITY) {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_cf8);
    configName = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_cf8);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&configName), bVar3) {
      configUpper.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      cmsys::SystemTools::UpperCase((string *)&__range3,(string *)configUpper.field_2._8_8_);
      __end3 = std::initializer_list<const_char_*>::begin(&cmTarget::configProps);
      ppcVar6 = std::initializer_list<const_char_*>::end(&cmTarget::configProps);
      for (; __end3 != ppcVar6; __end3 = __end3 + 1) {
        property.field_2._8_8_ = __end3;
        if ((this->TargetTypeValue != INTERFACE_LIBRARY) ||
           (iVar5 = strcmp(*__end3,"MAP_IMPORTED_CONFIG_"), iVar5 == 0)) {
          pcVar12 = *(char **)property.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_d98,pcVar12,
                     (allocator<char> *)(property_1.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(property_1.field_2._M_local_buf + 0xf));
          std::__cxx11::string::operator+=((string *)local_d98,(string *)&__range3);
          SetPropertyDefault(this,(string *)local_d98,(char *)0x0);
          std::__cxx11::string::~string((string *)local_d98);
        }
      }
      if ((this->TargetTypeValue != EXECUTABLE) && (this->TargetTypeValue != INTERFACE_LIBRARY)) {
        cmsys::SystemTools::UpperCase((string *)local_dc0,(string *)configUpper.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)local_dc0,"_POSTFIX");
        SetPropertyDefault(this,(string *)local_dc0,(char *)0x0);
        std::__cxx11::string::~string((string *)local_dc0);
      }
      std::__cxx11::string::~string((string *)&__range3);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  cmMakefile::GetBacktrace((cmMakefile *)&parentIncludes.End);
  cmListFileBacktrace::operator=(&this->Backtrace,(cmListFileBacktrace *)&parentIncludes.End);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&parentIncludes.End);
  bVar3 = IsImported(this);
  if (!bVar3) {
    cVar15 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(this->Makefile);
    parentIncludes.Begin = cVar15.End._M_current;
    parentIncludesBts.End._M_current = (cmListFileBacktrace *)cVar15.Begin._M_current;
    cVar16 = cmMakefile::GetIncludeDirectoriesBacktraces(this->Makefile);
    parentIncludesBts.Begin = cVar16.End._M_current;
    local_df0 = (undefined1  [8])cVar16.Begin._M_current;
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_e00._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pcVar8->IncludeDirectoriesEntries);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_df8,&local_e00);
    local_e08 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&parentIncludesBts.End);
    local_e10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&parentIncludesBts.End);
    local_e18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pcVar7,local_df8,local_e08,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_e10);
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_e28._M_current =
         (cmListFileBacktrace *)
         std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::end
                   (&pcVar8->IncludeDirectoriesBacktraces);
    __gnu_cxx::
    __normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
    ::__normal_iterator<cmListFileBacktrace*>
              ((__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
                *)&local_e20,&local_e28);
    _Var9 = cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
            ::begin((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                     *)local_df0);
    _Var10 = cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
             ::end((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                    *)local_df0);
    parentSystemIncludes._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
                 insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
                           ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                            &pcVar7->IncludeDirectoriesBacktraces,local_e20,_Var9,_Var10);
    psVar11 = cmMakefile::GetSystemIncludeDirectories_abi_cxx11_(this->Makefile);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_e70,psVar11);
    __first = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e70);
    __last = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e70);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->SystemIncludeDirectories,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__first._M_node,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__last._M_node);
    cVar15 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(this->Makefile);
    parentCompileOptionsBts.End._M_current = (cmListFileBacktrace *)cVar15.Begin._M_current;
    cVar16 = cmMakefile::GetCompileOptionsBacktraces(this->Makefile);
    parentCompileOptionsBts.Begin = cVar16.End._M_current;
    local_ea0 = (undefined1  [8])cVar16.Begin._M_current;
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_eb0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pcVar8->CompileOptionsEntries);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_ea8,&local_eb0);
    local_eb8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&parentCompileOptionsBts.End);
    local_ec0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&parentCompileOptionsBts.End);
    local_ec8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar7->CompileOptionsEntries,local_ea8,local_eb8,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_ec0);
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_ed8._M_current =
         (cmListFileBacktrace *)
         std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::end
                   (&pcVar8->CompileOptionsBacktraces);
    __gnu_cxx::
    __normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
    ::__normal_iterator<cmListFileBacktrace*>
              ((__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
                *)&local_ed0,&local_ed8);
    _Var9 = cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
            ::begin((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                     *)local_ea0);
    _Var10 = cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
             ::end((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                    *)local_ea0);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar7->CompileOptionsBacktraces,local_ed0,_Var9,_Var10);
    cVar15 = cmMakefile::GetLinkOptionsEntries_abi_cxx11_(this->Makefile);
    parentLinkOptionsBts.End._M_current = (cmListFileBacktrace *)cVar15.Begin._M_current;
    cVar16 = cmMakefile::GetLinkOptionsBacktraces(this->Makefile);
    parentLinkOptionsBts.Begin = cVar16.End._M_current;
    local_f10 = (undefined1  [8])cVar16.Begin._M_current;
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_f20._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pcVar8->LinkOptionsEntries);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_f18,&local_f20);
    local_f28 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&parentLinkOptionsBts.End);
    local_f30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&parentLinkOptionsBts.End);
    local_f38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar7->LinkOptionsEntries,local_f18,local_f28,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_f30);
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_f48._M_current =
         (cmListFileBacktrace *)
         std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::end
                   (&pcVar8->LinkOptionsBacktraces);
    __gnu_cxx::
    __normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
    ::__normal_iterator<cmListFileBacktrace*>
              ((__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
                *)&local_f40,&local_f48);
    _Var9 = cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
            ::begin((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                     *)local_f10);
    _Var10 = cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
             ::end((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                    *)local_f10);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar7->LinkOptionsBacktraces,local_f40,_Var9,_Var10);
    cVar15 = cmMakefile::GetLinkDirectoriesEntries_abi_cxx11_(this->Makefile);
    parentLinkDirectoriesBts.End._M_current = (cmListFileBacktrace *)cVar15.Begin._M_current;
    cVar16 = cmMakefile::GetLinkDirectoriesBacktraces(this->Makefile);
    parentLinkDirectoriesBts.Begin = cVar16.End._M_current;
    local_f80 = (undefined1  [8])cVar16.Begin._M_current;
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_f90._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pcVar8->LinkDirectoriesEntries);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_f88,&local_f90);
    local_f98 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&parentLinkDirectoriesBts.End);
    local_fa0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&parentLinkDirectoriesBts.End);
    local_fa8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pcVar7->LinkDirectoriesEntries,local_f88,local_f98,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_fa0);
    pcVar7 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar8 = cmTargetInternalPointer::operator->(&this->Internal);
    local_fb8._M_current =
         (cmListFileBacktrace *)
         std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::end
                   (&pcVar8->LinkDirectoriesBacktraces);
    __gnu_cxx::
    __normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
    ::__normal_iterator<cmListFileBacktrace*>
              ((__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
                *)&local_fb0,&local_fb8);
    local_fc0 = cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                ::begin((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                         *)local_f80);
    local_fc8 = (cmListFileBacktrace *)
                cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                ::end((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                       *)local_f80);
    local_fd0 = (cmListFileBacktrace *)
                std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
                insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
                          ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                           &pcVar7->LinkDirectoriesBacktraces,local_fb0,local_fc0,
                           (__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                            )local_fc8);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e70);
  }
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), TVar4 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ff0,"C_VISIBILITY_PRESET",&local_ff1);
    SetPropertyDefault(this,&local_ff0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_ff0);
    std::allocator<char>::~allocator(&local_ff1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1018,"CXX_VISIBILITY_PRESET",&local_1019);
    SetPropertyDefault(this,&local_1018,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1018);
    std::allocator<char>::~allocator(&local_1019);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1040,"CUDA_VISIBILITY_PRESET",&local_1041);
    SetPropertyDefault(this,&local_1040,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1040);
    std::allocator<char>::~allocator(&local_1041);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1068,"VISIBILITY_INLINES_HIDDEN",&local_1069);
    SetPropertyDefault(this,&local_1068,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1068);
    std::allocator<char>::~allocator(&local_1069);
  }
  if (this->TargetTypeValue == EXECUTABLE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1090,"ANDROID_GUI",&local_1091);
    SetPropertyDefault(this,&local_1090,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1090);
    std::allocator<char>::~allocator(&local_1091);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10b8,"CROSSCOMPILING_EMULATOR",&local_10b9);
    SetPropertyDefault(this,&local_10b8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_10b8);
    std::allocator<char>::~allocator(&local_10b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10e0,"ENABLE_EXPORTS",&local_10e1);
    SetPropertyDefault(this,&local_10e0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_10e0);
    std::allocator<char>::~allocator(&local_10e1);
  }
  if ((this->TargetTypeValue == SHARED_LIBRARY) || (this->TargetTypeValue == MODULE_LIBRARY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1108,"POSITION_INDEPENDENT_CODE",&local_1109);
    SetProperty(this,&local_1108,"True");
    std::__cxx11::string::~string((string *)&local_1108);
    std::allocator<char>::~allocator(&local_1109);
  }
  if ((this->TargetTypeValue == SHARED_LIBRARY) || (this->TargetTypeValue == EXECUTABLE)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1130,"WINDOWS_EXPORT_ALL_SYMBOLS",&local_1131);
    SetPropertyDefault(this,&local_1130,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1130);
    std::allocator<char>::~allocator(&local_1131);
  }
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), TVar4 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1158,"POSITION_INDEPENDENT_CODE",&local_1159);
    SetPropertyDefault(this,&local_1158,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1158);
    std::allocator<char>::~allocator(&local_1159);
  }
  cmMakefile::RecordPolicies(this->Makefile,&this->PolicyMap);
  if (this->TargetTypeValue == INTERFACE_LIBRARY) {
    cmPolicies::PolicyMap::Set(&this->PolicyMap,CMP0022,NEW);
  }
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), TVar4 != UTILITY)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1180,"JOB_POOL_COMPILE",&local_1181);
    SetPropertyDefault(this,&local_1180,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_1180);
    std::allocator<char>::~allocator(&local_1181);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11a8,"JOB_POOL_LINK",&local_11a9);
    SetPropertyDefault(this,&local_11a8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_11a8);
    std::allocator<char>::~allocator(&local_11a9);
  }
  if ((int)this->TargetTypeValue < 6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_11d0,"DOTNET_TARGET_FRAMEWORK_VERSION",
               (allocator<char> *)((long)&globals + 7));
    SetPropertyDefault(this,&local_11d0,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_11d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&globals + 7));
  }
  TVar4 = GetType(this);
  if ((TVar4 != INTERFACE_LIBRARY) && (TVar4 = GetType(this), pcVar1 = local_28, TVar4 != UTILITY))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1200,"CMAKE_VS_GLOBALS",
               (allocator<char> *)(genName.field_2._M_local_buf + 0xf));
    pcVar12 = cmMakefile::GetDefinition(pcVar1,&local_1200);
    std::__cxx11::string::~string((string *)&local_1200);
    std::allocator<char>::~allocator((allocator<char> *)(genName.field_2._M_local_buf + 0xf));
    local_11e0 = pcVar12;
    if (pcVar12 != (char *)0x0) {
      pcVar13 = cmMakefile::GetGlobalGenerator(local_28);
      (*pcVar13->_vptr_cmGlobalGenerator[3])
                (&props.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = cmHasLiteralPrefix<std::__cxx11::string,14ul>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &props.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (char (*) [14])"Visual Studio");
      if (bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1240);
        pcVar12 = local_11e0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1260,pcVar12,
                   (allocator<char> *)(vsGlobal.field_2._M_local_buf + 0xf));
        cmSystemTools::ExpandListArgument
                  (&local_1260,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1240,false);
        std::__cxx11::string::~string((string *)&local_1260);
        std::allocator<char>::~allocator((allocator<char> *)(vsGlobal.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1288,"VS_GLOBAL_",(allocator<char> *)((long)&__range4 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
        __end4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1240);
        i = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1240);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&i), bVar3) {
          pbVar14 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end4);
          propName.field_2._8_8_ = std::__cxx11::string::find((char)pbVar14,0x3d);
          if (propName.field_2._8_8_ != -1) {
            std::__cxx11::string::substr((ulong)((long)&propValue.field_2 + 8),(ulong)pbVar14);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_12d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1288,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&propValue.field_2 + 8));
            std::__cxx11::string::~string((string *)(propValue.field_2._M_local_buf + 8));
            std::__cxx11::string::substr((ulong)local_1318,(ulong)pbVar14);
            pcVar12 = (char *)std::__cxx11::string::c_str();
            SetPropertyDefault(this,(string *)local_12d8,pcVar12);
            std::__cxx11::string::~string(local_1318);
            std::__cxx11::string::~string((string *)local_12d8);
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4);
        }
        std::__cxx11::string::~string((string *)local_1288);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1240);
      }
      std::__cxx11::string::~string
                ((string *)
                 &props.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_cf8);
  return;
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf)
{
  assert(mf);
  this->IsGeneratorProvided = false;
  this->Name = name;
  this->TargetTypeValue = type;
  this->Makefile = mf;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  this->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->BuildInterfaceIncludesAppended = false;

  // Check whether this is a DLL platform.
  this->DLLPlatform =
    !this->Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX").empty();

  // Check whether we are targeting an Android platform.
  this->IsAndroid =
    (this->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME") == "Android");

  // Setup default property values.
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("ANDROID_API", nullptr);
    this->SetPropertyDefault("ANDROID_API_MIN", nullptr);
    this->SetPropertyDefault("ANDROID_ARCH", nullptr);
    this->SetPropertyDefault("ANDROID_STL_TYPE", nullptr);
    this->SetPropertyDefault("ANDROID_SKIP_ANT_STEP", nullptr);
    this->SetPropertyDefault("ANDROID_PROCESS_MAX", nullptr);
    this->SetPropertyDefault("ANDROID_PROGUARD", nullptr);
    this->SetPropertyDefault("ANDROID_PROGUARD_CONFIG_PATH", nullptr);
    this->SetPropertyDefault("ANDROID_SECURE_PROPS_PATH", nullptr);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DIRECTORIES", nullptr);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DEPENDENCIES", nullptr);
    this->SetPropertyDefault("ANDROID_JAVA_SOURCE_DIR", nullptr);
    this->SetPropertyDefault("ANDROID_JAR_DIRECTORIES", nullptr);
    this->SetPropertyDefault("ANDROID_JAR_DEPENDENCIES", nullptr);
    this->SetPropertyDefault("ANDROID_ASSETS_DIRECTORIES", nullptr);
    this->SetPropertyDefault("ANDROID_ANT_ADDITIONAL_OPTIONS", nullptr);
    this->SetPropertyDefault("BUILD_RPATH", nullptr);
    this->SetPropertyDefault("BUILD_RPATH_USE_ORIGIN", nullptr);
    this->SetPropertyDefault("INSTALL_NAME_DIR", nullptr);
    this->SetPropertyDefault("INSTALL_RPATH", "");
    this->SetPropertyDefault("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    this->SetPropertyDefault("INTERPROCEDURAL_OPTIMIZATION", nullptr);
    this->SetPropertyDefault("SKIP_BUILD_RPATH", "OFF");
    this->SetPropertyDefault("BUILD_WITH_INSTALL_RPATH", "OFF");
    this->SetPropertyDefault("ARCHIVE_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("LIBRARY_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("RUNTIME_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("PDB_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("COMPILE_PDB_OUTPUT_DIRECTORY", nullptr);
    this->SetPropertyDefault("Fortran_FORMAT", nullptr);
    this->SetPropertyDefault("Fortran_MODULE_DIRECTORY", nullptr);
    this->SetPropertyDefault("Fortran_COMPILER_LAUNCHER", nullptr);
    this->SetPropertyDefault("GNUtoMS", nullptr);
    this->SetPropertyDefault("OSX_ARCHITECTURES", nullptr);
    this->SetPropertyDefault("IOS_INSTALL_COMBINED", nullptr);
    this->SetPropertyDefault("AUTOMOC", nullptr);
    this->SetPropertyDefault("AUTOUIC", nullptr);
    this->SetPropertyDefault("AUTORCC", nullptr);
    this->SetPropertyDefault("AUTOGEN_ORIGIN_DEPENDS", nullptr);
    this->SetPropertyDefault("AUTOGEN_PARALLEL", nullptr);
    this->SetPropertyDefault("AUTOMOC_COMPILER_PREDEFINES", nullptr);
    this->SetPropertyDefault("AUTOMOC_DEPEND_FILTERS", nullptr);
    this->SetPropertyDefault("AUTOMOC_MACRO_NAMES", nullptr);
    this->SetPropertyDefault("AUTOMOC_MOC_OPTIONS", nullptr);
    this->SetPropertyDefault("AUTOUIC_OPTIONS", nullptr);
    this->SetPropertyDefault("AUTOUIC_SEARCH_PATHS", nullptr);
    this->SetPropertyDefault("AUTORCC_OPTIONS", nullptr);
    this->SetPropertyDefault("LINK_DEPENDS_NO_SHARED", nullptr);
    this->SetPropertyDefault("LINK_INTERFACE_LIBRARIES", nullptr);
    this->SetPropertyDefault("WIN32_EXECUTABLE", nullptr);
    this->SetPropertyDefault("MACOSX_BUNDLE", nullptr);
    this->SetPropertyDefault("MACOSX_RPATH", nullptr);
    this->SetPropertyDefault("NO_SYSTEM_FROM_IMPORTED", nullptr);
    this->SetPropertyDefault("BUILD_WITH_INSTALL_NAME_DIR", nullptr);
    this->SetPropertyDefault("C_CLANG_TIDY", nullptr);
    this->SetPropertyDefault("C_COMPILER_LAUNCHER", nullptr);
    this->SetPropertyDefault("C_CPPLINT", nullptr);
    this->SetPropertyDefault("C_CPPCHECK", nullptr);
    this->SetPropertyDefault("C_INCLUDE_WHAT_YOU_USE", nullptr);
    this->SetPropertyDefault("LINK_WHAT_YOU_USE", nullptr);
    this->SetPropertyDefault("C_STANDARD", nullptr);
    this->SetPropertyDefault("C_STANDARD_REQUIRED", nullptr);
    this->SetPropertyDefault("C_EXTENSIONS", nullptr);
    this->SetPropertyDefault("CXX_CLANG_TIDY", nullptr);
    this->SetPropertyDefault("CXX_COMPILER_LAUNCHER", nullptr);
    this->SetPropertyDefault("CXX_CPPLINT", nullptr);
    this->SetPropertyDefault("CXX_CPPCHECK", nullptr);
    this->SetPropertyDefault("CXX_INCLUDE_WHAT_YOU_USE", nullptr);
    this->SetPropertyDefault("CXX_STANDARD", nullptr);
    this->SetPropertyDefault("CXX_STANDARD_REQUIRED", nullptr);
    this->SetPropertyDefault("CXX_EXTENSIONS", nullptr);
    this->SetPropertyDefault("CUDA_STANDARD", nullptr);
    this->SetPropertyDefault("CUDA_STANDARD_REQUIRED", nullptr);
    this->SetPropertyDefault("CUDA_EXTENSIONS", nullptr);
    this->SetPropertyDefault("CUDA_COMPILER_LAUNCHER", nullptr);
    this->SetPropertyDefault("CUDA_SEPARABLE_COMPILATION", nullptr);
    this->SetPropertyDefault("LINK_SEARCH_START_STATIC", nullptr);
    this->SetPropertyDefault("LINK_SEARCH_END_STATIC", nullptr);
    this->SetPropertyDefault("FOLDER", nullptr);
#ifdef __APPLE__
    if (this->GetGlobalGenerator()->IsXcode()) {
      this->SetPropertyDefault("XCODE_SCHEME_ADDRESS_SANITIZER", nullptr);
      this->SetPropertyDefault(
        "XCODE_SCHEME_ADDRESS_SANITIZER_USE_AFTER_RETURN", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_THREAD_SANITIZER", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_THREAD_SANITIZER_STOP", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER",
                               nullptr);
      this->SetPropertyDefault(
        "XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER_STOP", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_DISABLE_MAIN_THREAD_CHECKER",
                               nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_MAIN_THREAD_CHECKER_STOP",
                               nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_MALLOC_SCRIBBLE", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_MALLOC_GUARD_EDGES", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_GUARD_MALLOC", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_ZOMBIE_OBJECTS", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_MALLOC_STACK", nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_DYNAMIC_LINKER_API_USAGE",
                               nullptr);
      this->SetPropertyDefault("XCODE_SCHEME_DYNAMIC_LIBRARY_LOADS", nullptr);
    }
#endif
  }

  // Collect the set of configuration types.
  std::vector<std::string> configNames;
  mf->GetConfigurations(configNames);

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY) {
    static const auto configProps = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_"
    };
    for (std::string const& configName : configNames) {
      std::string configUpper = cmSystemTools::UpperCase(configName);
      for (auto const& prop : configProps) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(prop, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = prop;
        property += configUpper;
        this->SetPropertyDefault(property, nullptr);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (this->TargetTypeValue != cmStateEnums::EXECUTABLE &&
          this->TargetTypeValue != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property = cmSystemTools::UpperCase(configName);
        property += "_POSTFIX";
        this->SetPropertyDefault(property, nullptr);
      }
    }
  }

  // Save the backtrace of target construction.
  this->Backtrace = this->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    const cmStringRange parentIncludes =
      this->Makefile->GetIncludeDirectoriesEntries();
    const cmBacktraceRange parentIncludesBts =
      this->Makefile->GetIncludeDirectoriesBacktraces();

    this->Internal->IncludeDirectoriesEntries.insert(
      this->Internal->IncludeDirectoriesEntries.end(), parentIncludes.begin(),
      parentIncludes.end());
    this->Internal->IncludeDirectoriesBacktraces.insert(
      this->Internal->IncludeDirectoriesBacktraces.end(),
      parentIncludesBts.begin(), parentIncludesBts.end());

    const std::set<std::string> parentSystemIncludes =
      this->Makefile->GetSystemIncludeDirectories();

    this->SystemIncludeDirectories.insert(parentSystemIncludes.begin(),
                                          parentSystemIncludes.end());

    const cmStringRange parentCompileOptions =
      this->Makefile->GetCompileOptionsEntries();
    const cmBacktraceRange parentCompileOptionsBts =
      this->Makefile->GetCompileOptionsBacktraces();

    this->Internal->CompileOptionsEntries.insert(
      this->Internal->CompileOptionsEntries.end(),
      parentCompileOptions.begin(), parentCompileOptions.end());
    this->Internal->CompileOptionsBacktraces.insert(
      this->Internal->CompileOptionsBacktraces.end(),
      parentCompileOptionsBts.begin(), parentCompileOptionsBts.end());

    const cmStringRange parentLinkOptions =
      this->Makefile->GetLinkOptionsEntries();
    const cmBacktraceRange parentLinkOptionsBts =
      this->Makefile->GetLinkOptionsBacktraces();

    this->Internal->LinkOptionsEntries.insert(
      this->Internal->LinkOptionsEntries.end(), parentLinkOptions.begin(),
      parentLinkOptions.end());
    this->Internal->LinkOptionsBacktraces.insert(
      this->Internal->LinkOptionsBacktraces.end(),
      parentLinkOptionsBts.begin(), parentLinkOptionsBts.end());

    const cmStringRange parentLinkDirectories =
      this->Makefile->GetLinkDirectoriesEntries();
    const cmBacktraceRange parentLinkDirectoriesBts =
      this->Makefile->GetLinkDirectoriesBacktraces();

    this->Internal->LinkDirectoriesEntries.insert(
      this->Internal->LinkDirectoriesEntries.end(),
      parentLinkDirectories.begin(), parentLinkDirectories.end());
    this->Internal->LinkDirectoriesBacktraces.insert(
      this->Internal->LinkDirectoriesBacktraces.end(),
      parentLinkDirectoriesBts.begin(), parentLinkDirectoriesBts.end());
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("C_VISIBILITY_PRESET", nullptr);
    this->SetPropertyDefault("CXX_VISIBILITY_PRESET", nullptr);
    this->SetPropertyDefault("CUDA_VISIBILITY_PRESET", nullptr);
    this->SetPropertyDefault("VISIBILITY_INLINES_HIDDEN", nullptr);
  }

  if (this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("ANDROID_GUI", nullptr);
    this->SetPropertyDefault("CROSSCOMPILING_EMULATOR", nullptr);
    this->SetPropertyDefault("ENABLE_EXPORTS", nullptr);
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("WINDOWS_EXPORT_ALL_SYMBOLS", nullptr);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("POSITION_INDEPENDENT_CODE", nullptr);
  }

  // Record current policies for later use.
  this->Makefile->RecordPolicies(this->PolicyMap);

  if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    this->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("JOB_POOL_COMPILE", nullptr);
    this->SetPropertyDefault("JOB_POOL_LINK", nullptr);
  }

  if (this->TargetTypeValue <= cmStateEnums::UTILITY) {
    this->SetPropertyDefault("DOTNET_TARGET_FRAMEWORK_VERSION", nullptr);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {

    // check for "CMAKE_VS_GLOBALS" variable and set up target properties
    // if any
    const char* globals = mf->GetDefinition("CMAKE_VS_GLOBALS");
    if (globals) {
      const std::string genName = mf->GetGlobalGenerator()->GetName();
      if (cmHasLiteralPrefix(genName, "Visual Studio")) {
        std::vector<std::string> props;
        cmSystemTools::ExpandListArgument(globals, props);
        const std::string vsGlobal = "VS_GLOBAL_";
        for (const std::string& i : props) {
          // split NAME=VALUE
          const std::string::size_type assignment = i.find('=');
          if (assignment != std::string::npos) {
            const std::string propName = vsGlobal + i.substr(0, assignment);
            const std::string propValue = i.substr(assignment + 1);
            this->SetPropertyDefault(propName, propValue.c_str());
          }
        }
      }
    }
  }
}